

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdAlphaBlend(int dst,int src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int tot_weight;
  int dst_weight;
  int src_weight;
  int blue;
  int green;
  int red;
  int alpha;
  int dst_alpha;
  int src_alpha;
  int src_local;
  int dst_local;
  
  iVar1 = (int)(src & 0x7f000000U) >> 0x18;
  src_local = src;
  if (((iVar1 != 0) && (iVar2 = (int)(dst & 0x7f000000U) >> 0x18, src_local = dst, iVar1 != 0x7f))
     && (src_local = src, iVar2 != 0x7f)) {
    iVar3 = 0x7f - iVar1;
    iVar4 = ((0x7f - iVar2) * iVar1) / 0x7f;
    iVar5 = iVar3 + iVar4;
    src_local = ((uint)(iVar1 * iVar2) / 0x7f) * 0x1000000 +
                ((((int)(src & 0xff0000U) >> 0x10) * iVar3 +
                 ((int)(dst & 0xff0000U) >> 0x10) * iVar4) / iVar5) * 0x10000 +
                ((((int)(src & 0xff00U) >> 8) * iVar3 + ((int)(dst & 0xff00U) >> 8) * iVar4) / iVar5
                ) * 0x100 + (int)((src & 0xffU) * iVar3 + (dst & 0xffU) * iVar4) / iVar5;
  }
  return src_local;
}

Assistant:

BGD_DECLARE(int) gdAlphaBlend (int dst, int src)
{
	int src_alpha = gdTrueColorGetAlpha(src);
	int dst_alpha, alpha, red, green, blue;
	int src_weight, dst_weight, tot_weight;

	/* -------------------------------------------------------------------- */
	/*      Simple cases we want to handle fast.                            */
	/* -------------------------------------------------------------------- */
	if( src_alpha == gdAlphaOpaque )
		return src;

	dst_alpha = gdTrueColorGetAlpha(dst);
	if( src_alpha == gdAlphaTransparent )
		return dst;
	if( dst_alpha == gdAlphaTransparent )
		return src;

	/* -------------------------------------------------------------------- */
	/*      What will the source and destination alphas be?  Note that      */
	/*      the destination weighting is substantially reduced as the       */
	/*      overlay becomes quite opaque.                                   */
	/* -------------------------------------------------------------------- */
	src_weight = gdAlphaTransparent - src_alpha;
	dst_weight = (gdAlphaTransparent - dst_alpha) * src_alpha / gdAlphaMax;
	tot_weight = src_weight + dst_weight;

	/* -------------------------------------------------------------------- */
	/*      What red, green and blue result values will we use?             */
	/* -------------------------------------------------------------------- */
	alpha = src_alpha * dst_alpha / gdAlphaMax;

	red = (gdTrueColorGetRed(src) * src_weight
	       + gdTrueColorGetRed(dst) * dst_weight) / tot_weight;
	green = (gdTrueColorGetGreen(src) * src_weight
	         + gdTrueColorGetGreen(dst) * dst_weight) / tot_weight;
	blue = (gdTrueColorGetBlue(src) * src_weight
	        + gdTrueColorGetBlue(dst) * dst_weight) / tot_weight;

	/* -------------------------------------------------------------------- */
	/*      Return merged result.                                           */
	/* -------------------------------------------------------------------- */
	return ((alpha << 24) + (red << 16) + (green << 8) + blue);
}